

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Householder.h
# Opt level: O0

void __thiscall
Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,-1,-1,false>>::
applyHouseholderOnTheLeft<Eigen::Matrix<double,1,1,0,1,1>>
          (MatrixBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>_> *this,
          Matrix<double,_1,_1,_0,_1,_1> *essential,Scalar *tau,Scalar *workspace)

{
  Index IVar1;
  Stride<0,_0> *this_00;
  DenseBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>_> *this_01;
  MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,_1,__1,_false>_>
  *other;
  ProductBase<Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_2>,_0,_Eigen::Stride<0,_0>_>,_2>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_2>,_0,_Eigen::Stride<0,_0>_>_>
  *in_RCX;
  EigenBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>_> *in_RDI;
  Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,_1,__1,_false> bottom;
  Map<Eigen::Matrix<double,_1,__1,_1,_1,_2>,_0,_Eigen::Stride<0,_0>_> tmp;
  PointerArgType in_stack_fffffffffffffda8;
  Map<Eigen::Matrix<double,_1,__1,_1,_1,_2>,_0,_Eigen::Stride<0,_0>_> *in_stack_fffffffffffffdb0;
  MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,_1,__1,_false>_>
  *in_stack_fffffffffffffdc0;
  Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false> *in_stack_fffffffffffffdc8;
  Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,_1,__1,_false>
  *in_stack_fffffffffffffdd0;
  Scalar *in_stack_fffffffffffffdd8;
  DenseBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>_>
  *in_stack_fffffffffffffde0;
  
  IVar1 = EigenBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_-1,_-1,_false>_>::rows
                    ((EigenBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>_>
                      *)0x305679);
  if (IVar1 == 1) {
    DenseBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_-1,_-1,_false>_>::operator*=
              (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  }
  else {
    this_00 = (Stride<0,_0> *)
              EigenBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_-1,_-1,_false>_>::cols
                        ((EigenBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>_>
                          *)0x3056c9);
    Stride<0,_0>::Stride(this_00);
    Map<Eigen::Matrix<double,_1,_-1,_1,_1,_2>,_0,_Eigen::Stride<0,_0>_>::Map
              (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,(Index)this_00,
               (Stride<0,_0> *)in_RCX);
    this_01 = (DenseBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>_> *)
              EigenBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_-1,_-1,_false>_>::derived
                        (in_RDI);
    IVar1 = EigenBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_-1,_-1,_false>_>::rows
                      ((EigenBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>_>
                        *)0x305712);
    other = (MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,_1,__1,_false>_>
             *)(IVar1 + -1);
    EigenBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_-1,_-1,_false>_>::cols
              ((EigenBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>_> *)
               0x305725);
    Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_-1,_-1,_false>,_1,_-1,_false>::Block
              (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,(Index)in_stack_fffffffffffffdc0,
               (Index)in_RDI,(Index)other,(Index)this_01);
    MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::adjoint
              ((MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)in_RCX);
    MatrixBase<Eigen::Transpose<Eigen::Matrix<double,1,1,0,1,1>const>>::operator*
              ((MatrixBase<Eigen::Transpose<const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_> *)in_RDI,
               other);
    MatrixBase<Eigen::Map<Eigen::Matrix<double,_1,_-1,_1,_1,_2>,_0,_Eigen::Stride<0,_0>_>_>::noalias
              ((MatrixBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_2>,_0,_Eigen::Stride<0,_0>_>_>
                *)in_RCX);
    NoAlias<Eigen::Map<Eigen::Matrix<double,1,-1,1,1,2>,0,Eigen::Stride<0,0>>,Eigen::MatrixBase>::
    operator=((NoAlias<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_2>,_0,_Eigen::Stride<0,_0>_>,_Eigen::MatrixBase>
               *)this_00,
              (MatrixBase<Eigen::GeneralProduct<Eigen::Transpose<const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,_1,__1,_false>,_2>_>
               *)in_RCX);
    DenseBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_-1,_-1,_false>_>::row
              (this_01,(Index)this_00);
    MatrixBase<Eigen::Map<Eigen::Matrix<double,1,-1,1,1,2>,0,Eigen::Stride<0,0>>>::operator+=
              ((MatrixBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_2>,_0,_Eigen::Stride<0,_0>_>_>
                *)in_stack_fffffffffffffdc0,
               (MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,_1,__1,_false>_>
                *)in_RDI);
    Eigen::operator*((Scalar *)this_01,(StorageBaseType *)this_00);
    DenseBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_-1,_-1,_false>_>::row
              (this_01,(Index)this_00);
    MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,-1,-1,false>,1,-1,false>>::
    operator-=(in_stack_fffffffffffffdc0,
               (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_2>,_0,_Eigen::Stride<0,_0>_>_>_>
                *)in_RDI);
    Eigen::operator*((Scalar *)this_01,(StorageBaseType *)this_00);
    MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Matrix<double,1,1,0,1,1>const>>
    ::operator*((MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                 *)in_RDI,
                (MatrixBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_2>,_0,_Eigen::Stride<0,_0>_>_>
                 *)other);
    MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_-1,_-1,_false>,_1,_-1,_false>_>
    ::noalias((MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,_1,__1,_false>_>
               *)in_RCX);
    NoAlias<Eigen::Block<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,-1,-1,false>,1,-1,false>,Eigen::MatrixBase>
    ::operator-=((NoAlias<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,_1,__1,_false>,_Eigen::MatrixBase>
                  *)this_00,in_RCX);
  }
  return;
}

Assistant:

void MatrixBase<Derived>::applyHouseholderOnTheLeft(
  const EssentialPart& essential,
  const Scalar& tau,
  Scalar* workspace)
{
  if(rows() == 1)
  {
    *this *= Scalar(1)-tau;
  }
  else
  {
    Map<typename internal::plain_row_type<PlainObject>::type> tmp(workspace,cols());
    Block<Derived, EssentialPart::SizeAtCompileTime, Derived::ColsAtCompileTime> bottom(derived(), 1, 0, rows()-1, cols());
    tmp.noalias() = essential.adjoint() * bottom;
    tmp += this->row(0);
    this->row(0) -= tau * tmp;
    bottom.noalias() -= tau * essential * tmp;
  }
}